

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry)

{
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__data.__list + 4) = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__data.__list + 0xc) = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex + 8) = 0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.arena_ = (Arena *)0x0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)0x0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_0046fb40;
  (this->map_).arena_ = (Arena *)0x0;
  (this->map_).default_enum_value_ = 0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Init(&this->map_);
  this->default_entry_ = default_entry;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry)
    : default_entry_(default_entry) {}